

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void build_sorted_tables(ecs_query_t *query)

{
  int32_t iVar1;
  void *pvVar2;
  int local_30;
  int local_2c;
  int32_t rank;
  int32_t start;
  ecs_matched_table_t *table;
  ecs_matched_table_t *tables;
  int32_t count;
  int32_t i;
  ecs_query_t *query_local;
  
  ecs_vector_free(query->table_slices);
  query->table_slices = (ecs_vector_t *)0x0;
  iVar1 = ecs_vector_count(query->tables);
  pvVar2 = _ecs_vector_first(query->tables,0x50,0x10);
  local_2c = 0;
  local_30 = 0;
  for (tables._4_4_ = 0; tables._4_4_ < iVar1; tables._4_4_ = tables._4_4_ + 1) {
    if (local_30 != *(int *)((long)pvVar2 + (long)tables._4_4_ * 0x50 + 0x48)) {
      if (local_2c != tables._4_4_) {
        build_sorted_table_range(query,local_2c,tables._4_4_);
        local_2c = tables._4_4_;
      }
      local_30 = *(int *)((long)pvVar2 + (long)tables._4_4_ * 0x50 + 0x48);
    }
  }
  if (local_2c != tables._4_4_) {
    build_sorted_table_range(query,local_2c,tables._4_4_);
  }
  return;
}

Assistant:

static
void build_sorted_tables(
    ecs_query_t *query)
{
    /* Clean previous sorted tables */
    ecs_vector_free(query->table_slices);
    query->table_slices = NULL;

    int32_t i, count = ecs_vector_count(query->tables);
    ecs_matched_table_t *tables = ecs_vector_first(query->tables, ecs_matched_table_t);
    ecs_matched_table_t *table = NULL;

    int32_t start = 0, rank = 0;
    for (i = 0; i < count; i ++) {
        table = &tables[i];
        if (rank != table->rank) {
            if (start != i) {
                build_sorted_table_range(query, start, i);
                start = i;
            }
            rank = table->rank;
        }
    }

    if (start != i) {
        build_sorted_table_range(query, start, i);
    }
}